

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

int SUNMatZero_Sparse(SUNMatrix A)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  pvVar1 = A->content;
  if (0 < *(int *)((long)pvVar1 + 8)) {
    lVar2 = *(long *)((long)pvVar1 + 0x10);
    lVar5 = *(long *)((long)pvVar1 + 0x20);
    lVar4 = 0;
    do {
      *(undefined8 *)(lVar2 + lVar4 * 8) = 0;
      *(undefined4 *)(lVar5 + lVar4 * 4) = 0;
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)((long)pvVar1 + 8));
  }
  iVar3 = *(int *)((long)pvVar1 + 0xc);
  if (0 < iVar3) {
    lVar2 = *(long *)((long)pvVar1 + 0x28);
    lVar5 = 0;
    do {
      *(undefined4 *)(lVar2 + lVar5 * 4) = 0;
      lVar5 = lVar5 + 1;
      iVar3 = *(int *)((long)pvVar1 + 0xc);
    } while (lVar5 < iVar3);
  }
  *(undefined4 *)(*(long *)((long)pvVar1 + 0x28) + (long)iVar3 * 4) = 0;
  return 0;
}

Assistant:

int SUNMatZero_Sparse(SUNMatrix A)
{
  sunindextype i;

  /* Perform operation */
  for (i=0; i<SM_NNZ_S(A); i++) {
    (SM_DATA_S(A))[i] = ZERO;
    (SM_INDEXVALS_S(A))[i] = 0;
  }
  for (i=0; i<SM_NP_S(A); i++)
    (SM_INDEXPTRS_S(A))[i] = 0;
  (SM_INDEXPTRS_S(A))[SM_NP_S(A)] = 0;
  return SUNMAT_SUCCESS;
}